

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          CappedArray<char,_14UL> *rest,ArrayPtr<const_char> *rest_1,CappedArray<char,_26UL> *rest_2
          ,ArrayPtr<const_char> *rest_3,CappedArray<char,_26UL> *rest_4)

{
  ArrayPtr<const_char> *pAVar1;
  char *pos_00;
  CappedArray<char,_14UL> *first_00;
  CappedArray<char,_26UL> *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  CappedArray<char,_26UL> *rest_3_00;
  ArrayPtr<const_char> *rest_local_1;
  CappedArray<char,_14UL> *rest_local;
  ArrayPtr<const_char> *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(first);
  pos_00 = _::fill<kj::ArrayPtr<char_const>>(pos,pAVar1);
  first_00 = fwd<kj::CappedArray<char,14ul>>(rest);
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  rest_1_00 = fwd<kj::CappedArray<char,26ul>>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::CappedArray<char,26ul>>(rest_4);
  fill<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (this,pos_00,branchIndex,first_00,pAVar1,rest_1_00,rest_2_00,rest_3_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}